

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::replaceLaneF64x2
          (Literal *__return_storage_ptr__,Literal *this,Literal *other,uint8_t index)

{
  reference this_00;
  undefined3 in_register_00000009;
  undefined1 local_58 [8];
  LaneArray<2> lanes;
  
  getLanesF64x2((LaneArray<2> *)local_58,this);
  this_00 = std::array<wasm::Literal,_2UL>::at
                      ((LaneArray<2> *)local_58,(ulong)CONCAT31(in_register_00000009,index));
  if (this_00 != other) {
    ~Literal(this_00);
    Literal(this_00,other);
  }
  Literal(__return_storage_ptr__,(LaneArray<2> *)local_58);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::replaceLaneF64x2(const Literal& other, uint8_t index) const {
  return replace<2, &Literal::getLanesF64x2>(*this, other, index);
}